

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkFormatArguments(CheckerVisitor *this,CallExpr *call)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  int iVar5;
  SQChar *__s;
  char *pcVar6;
  Expr *pEVar7;
  _func_int **pp_Var8;
  long lVar9;
  ulong uVar10;
  undefined8 *puVar11;
  long *__haystack;
  bool bVar12;
  string transformed;
  allocator<char> local_59;
  CallExpr *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->effectsOnly != false) {
    return;
  }
  uVar1 = (call->_args)._size;
  if ((ulong)uVar1 == 0) {
    return;
  }
  uVar10 = 0;
  do {
    for (pEVar7 = (call->_args)._vals[uVar10]; pEVar7 != (Expr *)0x0;
        pEVar7 = (Expr *)pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
      if ((pEVar7->super_Node)._op != TO_PAREN) goto LAB_001520dd;
    }
    pEVar7 = (Expr *)0x0;
LAB_001520dd:
    if (((pEVar7->super_Node)._op == TO_LITERAL) && (*(int *)&(pEVar7->super_Node).field_0x1c == 0))
    {
      pp_Var8 = pEVar7[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      iVar5 = 0;
      break;
    }
    uVar10 = uVar10 + 1;
    if (uVar10 == uVar1) {
      return;
    }
  } while( true );
LAB_00152106:
  if (*(char *)pp_Var8 == '%') {
    bVar12 = *(char *)((long)pp_Var8 + 1) != '%';
    if (!bVar12) {
      pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
    }
    iVar5 = iVar5 + (uint)bVar12;
  }
  else if (*(char *)pp_Var8 == '\0') goto LAB_0015212d;
  pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
  goto LAB_00152106;
LAB_0015212d:
  if (((iVar5 != 0) && (iVar5 != ~(uint)uVar10 + uVar1)) &&
     (__s = extractFunctionName(this,call), __s != (SQChar *)0x0)) {
    local_58 = call;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_59);
    plVar4 = local_50;
    __haystack = local_50;
    if (local_48 != 0) {
      lVar9 = 0;
      do {
        iVar5 = tolower((int)*(char *)((long)plVar4 + lVar9));
        *(char *)((long)plVar4 + lVar9) = (char)iVar5;
        lVar9 = lVar9 + 1;
        __haystack = local_50;
      } while (local_48 != lVar9);
    }
    puVar3 = DAT_001a8010;
    puVar2 = SQCompilationContext::format_function_name_abi_cxx11_;
    if (SQCompilationContext::format_function_name_abi_cxx11_ == DAT_001a8010) {
      bVar12 = false;
    }
    else {
      do {
        puVar11 = puVar2 + 4;
        pcVar6 = strstr((char *)__haystack,(char *)*puVar2);
        bVar12 = pcVar6 != (char *)0x0;
        if (bVar12) break;
        puVar2 = puVar11;
      } while (puVar11 != puVar3);
    }
    if (__haystack != local_40) {
      operator_delete(__haystack,local_40[0] + 1);
    }
    if (bVar12) {
      report(this,&(local_58->_args)._vals[uVar10]->super_Node,0x53);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkFormatArguments(const CallExpr *call) {
  if (effectsOnly)
    return;

  const auto &arguments = call->arguments();

  for (int32_t i = 0; i < arguments.size(); ++i) {
    const Expr *arg = deparen(arguments[i]);
    if (arg->op() == TO_LITERAL && arg->asLiteral()->kind() == LK_STRING) { // -V522
      int32_t formatsCount = 0;
      for (const SQChar *s = arg->asLiteral()->s(); *s; ++s) {
        if (*s == '%') {
          if (*(s + 1) == '%') {
            s++;
          }
          else {
            formatsCount++;
          }
        }
      }

      if (formatsCount && formatsCount != (arguments.size() - i - 1)) {
        const SQChar *name = extractFunctionName(call);
        if (!name)
          return;

        if (nameLooksLikeFormatFunction(name)) {
          report(arguments[i], DiagnosticsId::DI_FORMAT_ARGUMENTS_COUNT);
        }
      }

      return;
    }
  }
}